

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_microprops.h
# Opt level: O3

void __thiscall
icu_63::number::impl::MicroProps::processQuantity
          (MicroProps *this,DecimalQuantity *param_1,MicroProps *micros,UErrorCode *status)

{
  ScientificHandler *pSVar1;
  undefined4 uVar2;
  bool bVar3;
  long lVar4;
  FractionSignificantSettings *pFVar5;
  FractionSignificantSettings *pFVar6;
  
  if (this == micros) {
    bVar3 = true;
  }
  else {
    pFVar5 = (FractionSignificantSettings *)&this->rounder;
    pFVar6 = (FractionSignificantSettings *)&micros->rounder;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pFVar6 = *pFVar5;
      pFVar5 = pFVar5 + 1;
      pFVar6 = pFVar6 + 1;
    }
    uVar2 = *(undefined4 *)&(this->helpers).scientificModifier.field_0xc;
    pSVar1 = (this->helpers).scientificModifier.fHandler;
    (micros->helpers).scientificModifier.fExponent = (this->helpers).scientificModifier.fExponent;
    *(undefined4 *)&(micros->helpers).scientificModifier.field_0xc = uVar2;
    (micros->helpers).scientificModifier.fHandler = pSVar1;
    (micros->helpers).emptyWeakModifier.fStrong = (this->helpers).emptyWeakModifier.fStrong;
    (micros->helpers).emptyStrongModifier.fStrong = (this->helpers).emptyStrongModifier.fStrong;
    Scale::operator=(&(micros->helpers).multiplier.fMultiplier,
                     &(this->helpers).multiplier.fMultiplier);
    (micros->helpers).multiplier.fParent = (this->helpers).multiplier.fParent;
    bVar3 = this->exhausted;
  }
  micros->exhausted = bVar3;
  return;
}

Assistant:

void processQuantity(DecimalQuantity&, MicroProps& micros, UErrorCode& status) const U_OVERRIDE {
        (void) status;
        if (this == &micros) {
            // Unsafe path: no need to perform a copy.
            U_ASSERT(!exhausted);
            micros.exhausted = true;
            U_ASSERT(exhausted);
        } else {
            // Safe path: copy self into the output micros.
            micros = *this;
        }
    }